

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,cmComputeLinkInformation *pcli,
          cmLinkLineComputer *linkLineComputer,string *linkLibraries,string *frameworkPath,
          string *linkPath)

{
  cmMakefile *pcVar1;
  char *pcVar2;
  string *psVar3;
  string stdLibString;
  string standardLibsVar;
  string libPathTerminator;
  string fwSearchFlagVar;
  string libPathFlag;
  string fwSearchFlag;
  string linkLanguage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string *local_c0;
  string *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  psVar3 = &pcli->LinkLanguage;
  local_c0 = linkLibraries;
  local_b8 = linkPath;
  std::__cxx11::string::string(local_50,(string *)psVar3);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&local_140,(string *)psVar3);
  std::operator+(&local_120,"CMAKE_",&local_140);
  std::operator+(&local_100,&local_120,"_LIBRARY_PATH_FLAG");
  pcVar2 = cmMakefile::GetDefinition(pcVar1,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  if (pcVar2 == (char *)0x0) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"CMAKE_LIBRARY_PATH_FLAG",(allocator<char> *)&local_120);
    cmMakefile::GetRequiredDefinition(pcVar1,&local_100);
    std::__cxx11::string::_M_assign((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_100);
  }
  else {
    std::__cxx11::string::assign((char *)&local_90);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&local_e0,(string *)psVar3);
  std::operator+(&local_140,"CMAKE_",&local_e0);
  std::operator+(&local_120,&local_140,"_LIBRARY_PATH_TERMINATOR");
  pcVar2 = cmMakefile::GetDefinition(pcVar1,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_e0);
  if (pcVar2 == (char *)0x0) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"CMAKE_LIBRARY_PATH_TERMINATOR",(allocator<char> *)&local_140);
    cmMakefile::GetRequiredDefinition(pcVar1,&local_120);
    std::__cxx11::string::_M_assign((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  else {
    std::__cxx11::string::assign((char *)&local_100);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"CMAKE_",(allocator<char> *)&local_140);
  std::__cxx11::string::string((string *)&local_140,(string *)psVar3);
  std::__cxx11::string::append((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::append((char *)&local_120);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  pcVar2 = cmMakefile::GetDefinition(this->Makefile,&local_120);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&local_140);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"CMAKE_",(allocator<char> *)&local_70);
  std::__cxx11::string::append((string *)&local_e0);
  std::__cxx11::string::append((char *)&local_e0);
  psVar3 = cmMakefile::GetSafeDefinition(this->Makefile,&local_e0);
  std::__cxx11::string::string((string *)&local_70,(string *)psVar3);
  cmLinkLineComputer::ComputeFrameworkPath(&local_b0,linkLineComputer,pcli,&local_70);
  std::__cxx11::string::operator=((string *)frameworkPath,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  cmLinkLineComputer::ComputeLinkPath(&local_b0,linkLineComputer,pcli,&local_90,&local_100);
  std::__cxx11::string::operator=((string *)local_b8,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  (*linkLineComputer->_vptr_cmLinkLineComputer[3])(&local_b0,linkLineComputer,pcli,&local_140);
  std::__cxx11::string::operator=((string *)local_c0,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(
  cmComputeLinkInformation* pcli, cmLinkLineComputer* linkLineComputer,
  std::string& linkLibraries, std::string& frameworkPath,
  std::string& linkPath)
{
  cmComputeLinkInformation& cli = *pcli;

  std::string linkLanguage = cli.GetLinkLanguage();

  std::string libPathFlag;
  if (const char* value = this->Makefile->GetDefinition(
        "CMAKE_" + cli.GetLinkLanguage() + "_LIBRARY_PATH_FLAG")) {
    libPathFlag = value;
  } else {
    libPathFlag =
      this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  }

  std::string libPathTerminator;
  if (const char* value = this->Makefile->GetDefinition(
        "CMAKE_" + cli.GetLinkLanguage() + "_LIBRARY_PATH_TERMINATOR")) {
    libPathTerminator = value;
  } else {
    libPathTerminator =
      this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");
  }

  // Add standard libraries for this language.
  std::string standardLibsVar = "CMAKE_";
  standardLibsVar += cli.GetLinkLanguage();
  standardLibsVar += "_STANDARD_LIBRARIES";
  std::string stdLibString;
  if (const char* stdLibs = this->Makefile->GetDefinition(standardLibsVar)) {
    stdLibString = stdLibs;
  }

  // Append the framework search path flags.
  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += linkLanguage;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  std::string fwSearchFlag =
    this->Makefile->GetSafeDefinition(fwSearchFlagVar);

  frameworkPath = linkLineComputer->ComputeFrameworkPath(cli, fwSearchFlag);
  linkPath =
    linkLineComputer->ComputeLinkPath(cli, libPathFlag, libPathTerminator);

  linkLibraries = linkLineComputer->ComputeLinkLibraries(cli, stdLibString);
}